

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d0ed2::numeric<double>::validate
          (numeric<double> *this,json_pointer *ptr,json *instance,json_patch *param_3,
          error_handler *e)

{
  double __x;
  long lVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  ostringstream oss;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  long local_1c8 [2];
  double local_1b8;
  double local_1a0 [14];
  ios_base local_130 [264];
  
  local_1a0[0] = 0.0;
  nlohmann::json_abi_v3_11_2::detail::
  get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
            (instance,local_1a0);
  __x = local_1a0[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  if (((__x != 0.0) || (NAN(__x))) && ((this->multipleOf_).first != false)) {
    dVar3 = remainder(__x,(this->multipleOf_).second);
    dVar4 = ABS(__x / (this->multipleOf_).second);
    uVar2 = -(ulong)(1.0 < dVar4);
    local_1b8 = (double)(~uVar2 & (ulong)dVar3 | (ulong)(dVar3 / dVar4) & uVar2);
    dVar3 = nextafter(__x,0.0);
    if (ABS(dVar3 - __x) < ABS(local_1b8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"instance is not a multiple of ",0x1e);
      local_1d8.m_type = null;
      local_1d8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1d8,(this->multipleOf_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a0,&local_1d8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_1d8);
    }
  }
  if ((this->maximum_).first == true) {
    dVar3 = (this->maximum_).second;
    if ((this->exclusiveMaximum_ != true) || (__x < dVar3)) {
      if (__x <= dVar3) goto LAB_0013ab76;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"instance exceeds maximum of ",0x1c);
      local_1d8.m_type = null;
      local_1d8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1d8,(this->maximum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a0,&local_1d8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"instance exceeds or equals maximum of ",0x26);
      local_1d8.m_type = null;
      local_1d8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1d8,(this->maximum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a0,&local_1d8);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1d8);
  }
LAB_0013ab76:
  if ((this->minimum_).first == true) {
    dVar3 = (this->minimum_).second;
    if ((this->exclusiveMinimum_ != true) || (dVar3 < __x)) {
      if (dVar3 <= __x) goto LAB_0013ac35;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"instance is below minimum of ",0x1d);
      local_1d8.m_type = null;
      local_1d8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1d8,(this->minimum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a0,&local_1d8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"instance is below or equals minimum of ",0x27);
      local_1d8.m_type = null;
      local_1d8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1d8,(this->minimum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a0,&local_1d8);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1d8);
  }
LAB_0013ac35:
  std::ostream::seekp((long)local_1a0,_S_beg);
  lVar1 = std::ostream::tellp();
  if (lVar1 != 0) {
    std::ostream::seekp((long)local_1a0,_S_beg);
    std::__cxx11::stringbuf::str();
    (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1d8);
    if ((long *)CONCAT71(local_1d8._1_7_,local_1d8.m_type) != local_1c8) {
      operator_delete((long *)CONCAT71(local_1d8._1_7_,local_1d8.m_type),local_1c8[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		T value = instance; // conversion of json to value_type

		std::ostringstream oss;

		if (multipleOf_.first && value != 0) // zero is multiple of everything
			if (violates_multiple_of(value))
				oss << "instance is not a multiple of " << json(multipleOf_.second);

		if (maximum_.first) {
			if (exclusiveMaximum_ && value >= maximum_.second)
				oss << "instance exceeds or equals maximum of " << json(maximum_.second);
			else if (value > maximum_.second)
				oss << "instance exceeds maximum of " << json(maximum_.second);
		}

		if (minimum_.first) {
			if (exclusiveMinimum_ && value <= minimum_.second)
				oss << "instance is below or equals minimum of " << json(minimum_.second);
			else if (value < minimum_.second)
				oss << "instance is below minimum of " << json(minimum_.second);
		}

		oss.seekp(0, std::ios::end);
		auto size = oss.tellp();
		if (size != 0) {
			oss.seekp(0, std::ios::beg);
			e.error(ptr, instance, oss.str());
		}
	}